

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_linearsolver.c
# Opt level: O0

sunrealtype SUNLinSolResNorm(SUNLinearSolver S)

{
  long in_RDI;
  sunrealtype result;
  undefined8 local_10;
  
  if (*(long *)(*(long *)(in_RDI + 8) + 0x50) == 0) {
    local_10 = 0.0;
  }
  else {
    local_10 = (sunrealtype)(**(code **)(*(long *)(in_RDI + 8) + 0x50))(in_RDI);
  }
  return local_10;
}

Assistant:

sunrealtype SUNLinSolResNorm(SUNLinearSolver S)
{
  sunrealtype result;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(S));
  if (S->ops->resnorm) { result = S->ops->resnorm(S); }
  else { result = SUN_RCONST(0.0); }
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(S));
  return (result);
}